

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionClrStr.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionClrStr::write_cpp_code_seq
          (InstructionClrStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter,
          string *repl_data,string *repl_buf)

{
  StreamSep *this_00;
  StreamSep local_80;
  string *local_38;
  string *repl_buf_local;
  string *repl_data_local;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionClrStr *this_local;
  
  local_38 = repl_buf;
  repl_buf_local = repl_data;
  repl_data_local = (string *)cpp_emitter;
  cpp_emitter_local = (CppEmitter *)es;
  es_local = ss;
  ss_local = (StreamSepMaker *)this;
  StreamSepMaker::operator<<(&local_80,ss,(char (*) [12])0x24a862);
  this_00 = StreamSep::operator<<(&local_80,&this->var);
  StreamSep::operator<<(this_00,(char (*) [10])".clear();");
  StreamSep::~StreamSep(&local_80);
  return;
}

Assistant:

void InstructionClrStr::write_cpp_code_seq( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter, std::string repl_data, std::string repl_buf ) {
    ss << "HPIPE_DATA." << var << ".clear();";
}